

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::Dump(FlowGraph *this)

{
  code *pcVar1;
  BasicBlock **this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppBVar4;
  BasicBlock **block_1;
  Iterator __iter;
  Loop *loop_1;
  Loop *loop;
  BasicBlock *block;
  FlowGraph *this_local;
  
  Output::Print(L"\nFlowGraph\n");
  for (loop = (Loop *)this->blockList; loop != (Loop *)0x0; loop = *(Loop **)loop) {
    if ((loop->loopNumber & 1) == 0) {
      for (loop_1 = (Loop *)loop->topFunc; loop_1 != (Loop *)0x0; loop_1 = loop_1->parent) {
        Output::Print(L"    ");
      }
      BasicBlock::DumpHeader((BasicBlock *)loop,false);
    }
  }
  Output::Print(L"\nLoopGraph\n");
  __iter.current = (NodeBase *)this->loopList;
  do {
    if (__iter.current == (NodeBase *)0x0) {
      return;
    }
    Output::Print(L"\nLoop\n");
    _block_1 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                         ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                          (__iter.current + 4));
    while( true ) {
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_00 = block_1;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node)
      ;
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppBVar4 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&block_1);
      if ((*(ushort *)&(*ppBVar4)->field_0x18 & 1) == 0) {
        BasicBlock::DumpHeader(*ppBVar4,false);
      }
    }
    Output::Print(L"Loop  Ends\n");
    __iter.current = __iter.current[7].next;
  } while( true );
}

Assistant:

void
FlowGraph::Dump()
{
    Output::Print(_u("\nFlowGraph\n"));
    FOREACH_BLOCK(block, this)
    {
        Loop * loop = block->loop;
        while (loop)
        {
            Output::Print(_u("    "));
            loop = loop->parent;
        }
        block->DumpHeader(false);
    } NEXT_BLOCK;

    Output::Print(_u("\nLoopGraph\n"));

    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        Output::Print(_u("\nLoop\n"));
        FOREACH_BLOCK_IN_LOOP(block, loop)
        {
            block->DumpHeader(false);
        }NEXT_BLOCK_IN_LOOP;
        Output::Print(_u("Loop  Ends\n"));
    }
}